

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlineedit.cpp
# Opt level: O0

QSize __thiscall QLineEdit::minimumSizeHint(QLineEdit *this)

{
  int w_00;
  int iVar1;
  int iVar2;
  int *piVar3;
  QStyle *pQVar4;
  QSize QVar5;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  int w;
  int h;
  QLineEditPrivate *d;
  QMargins tm;
  QFontMetrics fm;
  QStyleOptionFrame opt;
  int in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  undefined1 local_88 [8];
  int local_80;
  int local_7c;
  undefined1 local_78 [24];
  undefined1 *local_60;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  undefined1 *local_38;
  undefined1 *puStack_30;
  undefined1 *local_28;
  undefined1 *puStack_20;
  undefined1 *local_18;
  undefined1 *puStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  d_func((QLineEdit *)0x5c46c0);
  QWidget::ensurePolished(in_RDI);
  local_60 = &DAT_aaaaaaaaaaaaaaaa;
  QWidget::fontMetrics((QWidget *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_78._0_16_ =
       (undefined1  [16])
       QLineEditPrivate::effectiveTextMargins
                 ((QLineEditPrivate *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58))
  ;
  w_00 = QFontMetrics::height();
  local_7c = 2;
  local_80 = QFontMetrics::leading();
  piVar3 = qMax<int>(&local_7c,&local_80);
  iVar1 = w_00 + *piVar3;
  iVar2 = QMargins::top((QMargins *)0x5c477c);
  iVar2 = iVar1 + iVar2;
  QMargins::bottom((QMargins *)0x5c4792);
  QFontMetrics::maxWidth();
  QMargins::left((QMargins *)0x5c47df);
  QMargins::right((QMargins *)0x5c47f5);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_10 = &DAT_aaaaaaaaaaaaaaaa;
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  QStyleOptionFrame::QStyleOptionFrame((QStyleOptionFrame *)0x5c4859);
  (**(code **)(*(long *)in_RDI + 0x1a0))(in_RDI,&local_58);
  pQVar4 = QWidget::style((QWidget *)CONCAT44(w_00,in_stack_ffffffffffffff08));
  QSize::QSize((QSize *)CONCAT44(iVar2,iVar1),w_00,in_stack_ffffffffffffff08);
  QVar5 = (QSize)(**(code **)(*(long *)pQVar4 + 0xe8))(pQVar4,0xe,&local_58,local_88,in_RDI);
  QStyleOptionFrame::~QStyleOptionFrame((QStyleOptionFrame *)0x5c48c9);
  QFontMetrics::~QFontMetrics((QFontMetrics *)&local_60);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return QVar5;
  }
  __stack_chk_fail();
}

Assistant:

QSize QLineEdit::minimumSizeHint() const
{
    Q_D(const QLineEdit);
    ensurePolished();
    QFontMetrics fm = fontMetrics();
    const QMargins tm = d->effectiveTextMargins();
    int h = fm.height() + qMax(2 * QLineEditPrivate::verticalMargin, fm.leading())
            + tm.top() + tm.bottom()
            + d->topmargin + d->bottommargin;
    int w = fm.maxWidth() + 2 * QLineEditPrivate::horizontalMargin
            + tm.left() + tm.right()
            + d->leftmargin + d->rightmargin;
    QStyleOptionFrame opt;
    initStyleOption(&opt);
    return style()->sizeFromContents(QStyle::CT_LineEdit, &opt, QSize(w, h), this);
}